

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::SampleList::~SampleList(SampleList *this)

{
  SampleList *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SampleList_0013db40;
  List::~List(&this->samples);
  SampleInfo::~SampleInfo(&this->sampleInfo);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~SampleList		(void) {}